

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_json_schema.c
# Opt level: O0

void jsons_print_uniques(lyout *out,lys_unique *unique,uint8_t unique_size,int *first)

{
  char *pcVar1;
  bool bVar2;
  int local_30;
  int local_2c;
  int j;
  int i;
  int *first_local;
  uint8_t unique_size_local;
  lys_unique *unique_local;
  lyout *out_local;
  
  if (unique_size != '\0') {
    bVar2 = false;
    if (first != (int *)0x0) {
      bVar2 = *first != 0;
    }
    pcVar1 = ",";
    if (bVar2) {
      pcVar1 = "";
    }
    ly_print(out,"%s\"uniques\":[",pcVar1);
    for (local_2c = 0; local_2c < (int)(uint)unique_size; local_2c = local_2c + 1) {
      pcVar1 = "";
      if (local_2c != 0) {
        pcVar1 = ",";
      }
      ly_print(out,"%s[",pcVar1);
      for (local_30 = 0; local_30 < (int)(uint)unique[local_2c].expr_size; local_30 = local_30 + 1)
      {
        pcVar1 = "";
        if (local_30 != 0) {
          pcVar1 = ",";
        }
        ly_print(out,"%s\"%s\"",pcVar1,unique[local_2c].expr[local_30]);
      }
      ly_print(out,"]");
    }
    ly_print(out,"]");
    if (first != (int *)0x0) {
      *first = 0;
    }
  }
  return;
}

Assistant:

static void
jsons_print_uniques(struct lyout *out, const struct lys_unique *unique, uint8_t unique_size, int *first)
{
    int i, j;

    if (!unique_size) {
        return;
    }

    ly_print(out, "%s\"uniques\":[", (first && (*first)) ? "" : ",");
    for (i = 0; i < unique_size; ++i) {
        ly_print(out, "%s[", i ? "," : "");
        for (j = 0; j < unique[i].expr_size; ++j) {
            ly_print(out, "%s\"%s\"", j ? "," : "", unique[i].expr[j]);
        }
        ly_print(out, "]");
    }
    ly_print(out, "]");
    if (first) {
        (*first) = 0;
    }
}